

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microterm.cpp
# Opt level: O2

void __thiscall MicroTerm::connectionClosed(MicroTerm *this,Stream *stream,bool abnormal)

{
  ostream *poVar1;
  string sStack_48;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Closed connection ");
  Dashel::Stream::getTargetName_abi_cxx11_(&sStack_48,stream);
  poVar1 = std::operator<<(poVar1,(string *)&sStack_48);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,")");
  std::__cxx11::string::~string((string *)&sStack_48);
  if (abnormal) {
    poVar1 = std::operator<<((ostream *)&std::cout," : ");
    std::operator<<(poVar1,(string *)(stream + 0x10));
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  Dashel::Hub::stop();
  return;
}

Assistant:

void connectionClosed(Stream* stream, bool abnormal)
	{
		cout << "Closed connection " << stream->getTargetName() << " (" << stream << ")";
		if (abnormal)
			cout << " : " << stream->getFailReason();
		cout << endl;
		stop();
	}